

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MySharedMemory.cpp
# Opt level: O0

void __thiscall MySharedMemory::detach(MySharedMemory *this)

{
  char *pcVar1;
  MySharedMemory *this_local;
  
  sem_close((sem_t *)this->sem);
  munmap(this->addr,this->mapping_size);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  sem_unlink(pcVar1);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  shm_unlink(pcVar1);
  return;
}

Assistant:

void MySharedMemory::detach() {
    #ifdef _WIN32
    UnmapViewOfFile(addr);
    #elif __linux__ || __APPLE__
    sem_close(sem);
    munmap(addr, mapping_size);
    sem_unlink(key.c_str());
    shm_unlink(key.c_str());
    #endif
}